

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O2

void __thiscall dgGoogol::ShiftRightMantissa(dgGoogol *this,HaU64 *mantissa,HaI32 bits)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = (long)*mantissa >> 0x3f;
  for (; 0x3f < bits; bits = bits - 0x40) {
    for (uVar3 = 2; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
      mantissa[uVar3 + 1] = mantissa[uVar3];
    }
    *mantissa = uVar1;
  }
  if (0 < bits) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      uVar3 = uVar1 << ((ulong)(0x40 - bits) & 0x3f);
      uVar1 = mantissa[lVar2];
      mantissa[lVar2] = uVar1 >> ((ulong)(uint)bits & 0x3f) | uVar3;
    }
  }
  return;
}

Assistant:

void dgGoogol::ShiftRightMantissa (hacd::HaU64* const mantissa, hacd::HaI32 bits) const
{
	hacd::HaU64 carrier = 0;
	if (hacd::HaI64 (mantissa[0]) < hacd::HaI64 (0)) {
		carrier = hacd::HaU64 (-1);
	}
	
	while (bits >= 64) {
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 2; i >= 0; i --) {
			mantissa[i + 1] = mantissa[i];
		}
		mantissa[0] = carrier;
		bits -= 64;
	}

	if (bits > 0) {
		carrier <<= (64 - bits);
		for (hacd::HaI32 i = 0; i < DG_GOOGOL_SIZE; i ++) {
			hacd::HaU64 a = mantissa[i];
			mantissa[i] = (a >> bits) | carrier;
			carrier = a << (64 - bits);
		}
	}
}